

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  Geometry *this;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  long lVar18;
  byte bVar19;
  byte bVar20;
  ulong *puVar21;
  ulong uVar22;
  long lVar23;
  size_t i;
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2458 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    return false;
  }
  local_2370[0] = 0;
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
  auVar46 = ZEXT3264(auVar27);
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_2458 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_2458 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  puVar21 = local_2368;
  auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
  auVar48 = ZEXT3264(auVar31);
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
  auVar50 = ZEXT3264(auVar31);
  auVar26 = vmulss_avx512f(auVar27._0_16_,auVar27._0_16_);
  auVar27._0_4_ = auVar26._0_4_;
  auVar27._4_4_ = auVar27._0_4_;
  auVar27._8_4_ = auVar27._0_4_;
  auVar27._12_4_ = auVar27._0_4_;
  auVar27._16_4_ = auVar27._0_4_;
  auVar27._20_4_ = auVar27._0_4_;
  auVar27._24_4_ = auVar27._0_4_;
  auVar27._28_4_ = auVar27._0_4_;
  bVar17 = false;
  auVar31 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar51 = ZEXT3264(auVar31);
  auVar31 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar52 = ZEXT3264(auVar31);
LAB_01f28422:
  auVar45 = auVar46._0_32_;
  auVar31 = vsubps_avx512vl(auVar28,auVar45);
  auVar32 = vaddps_avx512vl(auVar28,auVar45);
  auVar47 = auVar48._0_32_;
  auVar33 = vsubps_avx512vl(auVar29,auVar47);
  auVar34 = vaddps_avx512vl(auVar29,auVar47);
  auVar49 = auVar50._0_32_;
  auVar35 = vsubps_avx512vl(auVar30,auVar49);
  auVar36 = vaddps_avx512vl(auVar30,auVar49);
LAB_01f28446:
  pfVar1 = (float *)(puVar21 + -1);
  puVar21 = puVar21 + -2;
  if (*pfVar1 <= (float)local_2458._0_4_) {
    uVar22 = *puVar21;
    do {
      do {
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar22 & 8) != 0) {
LAB_01f288be:
            uVar25 = (ulong)((uint)uVar22 & 0xf);
            if (uVar25 == 8) goto LAB_01f28a4f;
            lVar23 = (uVar22 & 0xfffffffffffffff0) + 0x50;
            lVar18 = 0;
            bVar19 = 0;
            goto LAB_01f28906;
          }
          auVar37 = vmaxps_avx512vl(auVar28,*(undefined1 (*) [32])(uVar22 + 0x40));
          auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar22 + 0x60));
          auVar38 = vsubps_avx512vl(auVar37,auVar28);
          auVar37 = vmaxps_avx512vl(auVar29,*(undefined1 (*) [32])(uVar22 + 0x80));
          auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar22 + 0xa0));
          auVar39 = vsubps_avx512vl(auVar37,auVar29);
          auVar37 = vmaxps_avx512vl(auVar30,*(undefined1 (*) [32])(uVar22 + 0xc0));
          auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar22 + 0xe0));
          auVar37 = vsubps_avx512vl(auVar37,auVar30);
          auVar43._0_4_ =
               auVar37._0_4_ * auVar37._0_4_ +
               auVar39._0_4_ * auVar39._0_4_ + auVar38._0_4_ * auVar38._0_4_;
          auVar43._4_4_ =
               auVar37._4_4_ * auVar37._4_4_ +
               auVar39._4_4_ * auVar39._4_4_ + auVar38._4_4_ * auVar38._4_4_;
          auVar43._8_4_ =
               auVar37._8_4_ * auVar37._8_4_ +
               auVar39._8_4_ * auVar39._8_4_ + auVar38._8_4_ * auVar38._8_4_;
          auVar43._12_4_ =
               auVar37._12_4_ * auVar37._12_4_ +
               auVar39._12_4_ * auVar39._12_4_ + auVar38._12_4_ * auVar38._12_4_;
          auVar43._16_4_ =
               auVar37._16_4_ * auVar37._16_4_ +
               auVar39._16_4_ * auVar39._16_4_ + auVar38._16_4_ * auVar38._16_4_;
          auVar43._20_4_ =
               auVar37._20_4_ * auVar37._20_4_ +
               auVar39._20_4_ * auVar39._20_4_ + auVar38._20_4_ * auVar38._20_4_;
          auVar43._24_4_ =
               auVar37._24_4_ * auVar37._24_4_ +
               auVar39._24_4_ * auVar39._24_4_ + auVar38._24_4_ * auVar38._24_4_;
          auVar43._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar38._28_4_;
          uVar25 = vcmpps_avx512vl(auVar43,auVar27,2);
          uVar7 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0x40),
                                  *(undefined1 (*) [32])(uVar22 + 0x60),2);
          uVar25 = uVar25 & uVar7;
        }
        else {
          if ((uVar22 & 8) != 0) goto LAB_01f288be;
          auVar37 = *(undefined1 (*) [32])(uVar22 + 0x40);
          auVar38 = *(undefined1 (*) [32])(uVar22 + 0x60);
          auVar39 = vmaxps_avx512vl(auVar28,auVar37);
          auVar39 = vminps_avx(auVar39,auVar38);
          auVar41 = vsubps_avx512vl(auVar39,auVar28);
          auVar39 = vmaxps_avx512vl(auVar29,*(undefined1 (*) [32])(uVar22 + 0x80));
          auVar39 = vminps_avx(auVar39,*(undefined1 (*) [32])(uVar22 + 0xa0));
          auVar40 = vsubps_avx512vl(auVar39,auVar29);
          auVar39 = vmaxps_avx512vl(auVar30,*(undefined1 (*) [32])(uVar22 + 0xc0));
          auVar39 = vminps_avx(auVar39,*(undefined1 (*) [32])(uVar22 + 0xe0));
          auVar39 = vsubps_avx512vl(auVar39,auVar30);
          auVar43._0_4_ =
               auVar39._0_4_ * auVar39._0_4_ +
               auVar40._0_4_ * auVar40._0_4_ + auVar41._0_4_ * auVar41._0_4_;
          auVar43._4_4_ =
               auVar39._4_4_ * auVar39._4_4_ +
               auVar40._4_4_ * auVar40._4_4_ + auVar41._4_4_ * auVar41._4_4_;
          auVar43._8_4_ =
               auVar39._8_4_ * auVar39._8_4_ +
               auVar40._8_4_ * auVar40._8_4_ + auVar41._8_4_ * auVar41._8_4_;
          auVar43._12_4_ =
               auVar39._12_4_ * auVar39._12_4_ +
               auVar40._12_4_ * auVar40._12_4_ + auVar41._12_4_ * auVar41._12_4_;
          auVar43._16_4_ =
               auVar39._16_4_ * auVar39._16_4_ +
               auVar40._16_4_ * auVar40._16_4_ + auVar41._16_4_ * auVar41._16_4_;
          auVar43._20_4_ =
               auVar39._20_4_ * auVar39._20_4_ +
               auVar40._20_4_ * auVar40._20_4_ + auVar41._20_4_ * auVar41._20_4_;
          auVar43._24_4_ =
               auVar39._24_4_ * auVar39._24_4_ +
               auVar40._24_4_ * auVar40._24_4_ + auVar41._24_4_ * auVar41._24_4_;
          auVar43._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar41._28_4_;
          uVar14 = vcmpps_avx512vl(auVar37,auVar38,2);
          uVar8 = vcmpps_avx512vl(auVar38,auVar31,1);
          uVar9 = vcmpps_avx512vl(auVar37,auVar32,6);
          uVar10 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0xa0),auVar33,1);
          uVar11 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0x80),auVar34,6);
          uVar12 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0xe0),auVar35,1);
          uVar13 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0xc0),auVar36,6);
          uVar25 = (ulong)(byte)(~((byte)uVar11 | (byte)uVar9 | (byte)uVar13 | (byte)uVar8 |
                                  (byte)uVar10 | (byte)uVar12) & (byte)uVar14);
        }
        bVar19 = (byte)uVar25;
        if (bVar19 == 0) {
          if (puVar21 == &local_2378) {
            return bVar17;
          }
          goto LAB_01f28446;
        }
        auVar37 = *(undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0);
        auVar38 = ((undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0))[1];
        auVar39 = vmovdqa64_avx512vl(auVar51._0_32_);
        auVar39 = vpternlogd_avx512vl(auVar39,auVar43,auVar52._0_32_,0xf8);
        auVar40 = vpcompressd_avx512vl(auVar39);
        auVar41._0_4_ =
             (uint)(bVar19 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar39._0_4_;
        bVar16 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar16 * auVar40._4_4_ | (uint)!bVar16 * auVar39._4_4_;
        bVar16 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar16 * auVar40._8_4_ | (uint)!bVar16 * auVar39._8_4_;
        bVar16 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar16 * auVar40._12_4_ | (uint)!bVar16 * auVar39._12_4_;
        bVar16 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar16 * auVar40._16_4_ | (uint)!bVar16 * auVar39._16_4_;
        bVar16 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar16 * auVar40._20_4_ | (uint)!bVar16 * auVar39._20_4_;
        bVar16 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar16 * auVar40._24_4_ | (uint)!bVar16 * auVar39._24_4_;
        bVar16 = SUB81(uVar25 >> 7,0);
        auVar41._28_4_ = (uint)bVar16 * auVar40._28_4_ | (uint)!bVar16 * auVar39._28_4_;
        auVar39 = vpermt2q_avx512vl(auVar37,auVar41,auVar38);
        uVar22 = auVar39._0_8_;
        bVar19 = bVar19 - 1 & bVar19;
      } while (bVar19 == 0);
      auVar39 = vpshufd_avx2(auVar41,0x55);
      vpermt2q_avx512vl(auVar37,auVar39,auVar38);
      auVar40 = vpminsd_avx2(auVar41,auVar39);
      auVar39 = vpmaxsd_avx2(auVar41,auVar39);
      bVar19 = bVar19 - 1 & bVar19;
      if (bVar19 == 0) {
        auVar41 = vpermi2q_avx512vl(auVar40,auVar37,auVar38);
        uVar22 = auVar41._0_8_;
        auVar37 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
        *puVar21 = auVar37._0_8_;
        auVar37 = vpermd_avx2(auVar39,auVar43);
        *(int *)(puVar21 + 1) = auVar37._0_4_;
        puVar21 = puVar21 + 2;
      }
      else {
        auVar6 = vpshufd_avx2(auVar41,0xaa);
        vpermt2q_avx512vl(auVar37,auVar6,auVar38);
        auVar4 = vpminsd_avx2(auVar40,auVar6);
        auVar40 = vpmaxsd_avx2(auVar40,auVar6);
        auVar6 = vpminsd_avx2(auVar39,auVar40);
        auVar39 = vpmaxsd_avx2(auVar39,auVar40);
        bVar19 = bVar19 - 1 & bVar19;
        if (bVar19 == 0) {
          auVar41 = vpermi2q_avx512vl(auVar4,auVar37,auVar38);
          uVar22 = auVar41._0_8_;
          auVar41 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
          *puVar21 = auVar41._0_8_;
          auVar39 = vpermd_avx2(auVar39,auVar43);
          *(int *)(puVar21 + 1) = auVar39._0_4_;
          auVar37 = vpermt2q_avx512vl(auVar37,auVar6,auVar38);
          puVar21[2] = auVar37._0_8_;
          auVar37 = vpermd_avx2(auVar6,auVar43);
          *(int *)(puVar21 + 3) = auVar37._0_4_;
          puVar21 = puVar21 + 4;
        }
        else {
          auVar40 = vpshufd_avx2(auVar41,0xff);
          vpermt2q_avx512vl(auVar37,auVar40,auVar38);
          auVar5 = vpminsd_avx2(auVar4,auVar40);
          auVar40 = vpmaxsd_avx2(auVar4,auVar40);
          auVar4 = vpminsd_avx2(auVar6,auVar40);
          auVar40 = vpmaxsd_avx2(auVar6,auVar40);
          auVar6 = vpminsd_avx2(auVar39,auVar40);
          auVar39 = vpmaxsd_avx2(auVar39,auVar40);
          bVar19 = bVar19 - 1 & bVar19;
          if (bVar19 == 0) {
            auVar41 = vpermi2q_avx512vl(auVar5,auVar37,auVar38);
            uVar22 = auVar41._0_8_;
            auVar41 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
            *puVar21 = auVar41._0_8_;
            auVar39 = vpermd_avx2(auVar39,auVar43);
            *(int *)(puVar21 + 1) = auVar39._0_4_;
            auVar39 = vpermt2q_avx512vl(auVar37,auVar6,auVar38);
            puVar21[2] = auVar39._0_8_;
            auVar39 = vpermd_avx2(auVar6,auVar43);
            *(int *)(puVar21 + 3) = auVar39._0_4_;
            auVar37 = vpermt2q_avx512vl(auVar37,auVar4,auVar38);
            puVar21[4] = auVar37._0_8_;
            auVar37 = vpermd_avx2(auVar4,auVar43);
            *(int *)(puVar21 + 5) = auVar37._0_4_;
            puVar21 = puVar21 + 6;
          }
          else {
            auVar42 = valignd_avx512vl(auVar41,auVar41,3);
            auVar41 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar40 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar41,auVar5);
            auVar41 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar40 = vpermt2d_avx512vl(auVar40,auVar41,auVar4);
            auVar40 = vpermt2d_avx512vl(auVar40,auVar41,auVar6);
            auVar41 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar39 = vpermt2d_avx512vl(auVar40,auVar41,auVar39);
            auVar44 = ZEXT3264(auVar39);
            bVar20 = bVar19;
            do {
              auVar41 = auVar44._0_32_;
              auVar39._8_4_ = 1;
              auVar39._0_8_ = 0x100000001;
              auVar39._12_4_ = 1;
              auVar39._16_4_ = 1;
              auVar39._20_4_ = 1;
              auVar39._24_4_ = 1;
              auVar39._28_4_ = 1;
              auVar39 = vpermd_avx2(auVar39,auVar42);
              auVar42 = valignd_avx512vl(auVar42,auVar42,1);
              vpermt2q_avx512vl(auVar37,auVar42,auVar38);
              bVar20 = bVar20 - 1 & bVar20;
              uVar14 = vpcmpd_avx512vl(auVar39,auVar41,5);
              auVar39 = vpmaxsd_avx2(auVar39,auVar41);
              bVar15 = (byte)uVar14 << 1;
              auVar41 = valignd_avx512vl(auVar41,auVar41,7);
              bVar16 = (bool)((byte)uVar14 & 1);
              auVar40._4_4_ = (uint)bVar16 * auVar41._4_4_ | (uint)!bVar16 * auVar39._4_4_;
              auVar40._0_4_ = auVar39._0_4_;
              bVar16 = (bool)(bVar15 >> 2 & 1);
              auVar40._8_4_ = (uint)bVar16 * auVar41._8_4_ | (uint)!bVar16 * auVar39._8_4_;
              bVar16 = (bool)(bVar15 >> 3 & 1);
              auVar40._12_4_ = (uint)bVar16 * auVar41._12_4_ | (uint)!bVar16 * auVar39._12_4_;
              bVar16 = (bool)(bVar15 >> 4 & 1);
              auVar40._16_4_ = (uint)bVar16 * auVar41._16_4_ | (uint)!bVar16 * auVar39._16_4_;
              bVar16 = (bool)(bVar15 >> 5 & 1);
              auVar40._20_4_ = (uint)bVar16 * auVar41._20_4_ | (uint)!bVar16 * auVar39._20_4_;
              bVar16 = (bool)(bVar15 >> 6 & 1);
              auVar40._24_4_ = (uint)bVar16 * auVar41._24_4_ | (uint)!bVar16 * auVar39._24_4_;
              auVar40._28_4_ =
                   (uint)(bVar15 >> 7) * auVar41._28_4_ |
                   (uint)!(bool)(bVar15 >> 7) * auVar39._28_4_;
              auVar44 = ZEXT3264(auVar40);
            } while (bVar20 != 0);
            lVar18 = (ulong)(uint)POPCOUNT((uint)bVar19) + 3;
            do {
              auVar39 = vpermi2q_avx512vl(auVar40,auVar37,auVar38);
              *puVar21 = auVar39._0_8_;
              auVar41 = auVar44._0_32_;
              auVar39 = vpermd_avx2(auVar41,auVar43);
              *(int *)(puVar21 + 1) = auVar39._0_4_;
              auVar40 = valignd_avx512vl(auVar41,auVar41,1);
              puVar21 = puVar21 + 2;
              auVar44 = ZEXT3264(auVar40);
              lVar18 = lVar18 + -1;
            } while (lVar18 != 0);
            auVar37 = vpermt2q_avx512vl(auVar37,auVar40,auVar38);
            uVar22 = auVar37._0_8_;
          }
        }
      }
    } while( true );
  }
  goto LAB_01f28a4f;
LAB_01f28906:
  do {
    bVar20 = 0;
    lVar24 = 0;
    do {
      if (*(int *)(lVar23 + lVar24 * 4) == -1) break;
      uVar3 = *(uint *)(lVar23 + -0x10 + lVar24 * 4);
      this = (context->scene->geometries).items[uVar3].ptr;
      context->geomID = uVar3;
      context->primID = *(uint *)(lVar23 + lVar24 * 4);
      bVar16 = Geometry::pointQuery(this,query,context);
      bVar20 = bVar20 | bVar16;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 4);
    bVar19 = bVar19 | bVar20;
    lVar18 = lVar18 + 1;
    lVar23 = lVar23 + 0x60;
  } while (lVar18 != uVar25 - 8);
  if (bVar19 == 0) {
    auVar46 = ZEXT3264(auVar45);
    auVar48 = ZEXT3264(auVar47);
    auVar50 = ZEXT3264(auVar49);
    auVar27 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar51 = ZEXT3264(auVar27);
    auVar27 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar52 = ZEXT3264(auVar27);
  }
  else {
    auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
    auVar46 = ZEXT3264(auVar27);
    auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar48 = ZEXT3264(auVar27);
    auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar50 = ZEXT3264(auVar27);
    auVar27 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar51 = ZEXT3264(auVar27);
    auVar27 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar52 = ZEXT3264(auVar27);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2458 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_2458 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar17 = true;
  }
LAB_01f28a4f:
  auVar27 = vmulps_avx512vl(auVar46._0_32_,auVar46._0_32_);
  if (puVar21 == &local_2378) {
    return bVar17;
  }
  goto LAB_01f28422;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }